

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::visitExport(PrintSExpression *this,Export *curr)

{
  ostream *poVar1;
  char *in_RCX;
  long lVar2;
  char *pcVar3;
  variant<wasm::Name,_wasm::HeapType> *this_00;
  string_view str;
  stringstream local_1d8 [8];
  stringstream escaped;
  String local_1c8 [112];
  ios_base local_158 [264];
  char local_50;
  undefined7 uStack_4f;
  long local_48;
  long local_40 [2];
  
  local_1d8[0] = (stringstream)0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)local_1d8,1);
  poVar1 = this->o;
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"export ",7);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  std::__cxx11::stringstream::stringstream(local_1d8);
  str._M_str = in_RCX;
  str._M_len = (size_t)(curr->name).super_IString.str._M_str;
  String::printEscaped(local_1c8,(ostream *)(curr->name).super_IString.str._M_len,str);
  poVar1 = this->o;
  std::__cxx11::stringbuf::str();
  pcVar3 = (char *)CONCAT71(uStack_4f,local_50);
  Colors::outputColorCode(poVar1,"\x1b[32m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,local_48);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  switch(curr->kind) {
  case Function:
    lVar2 = 4;
    pcVar3 = "func";
    break;
  case Table:
    lVar2 = 5;
    pcVar3 = "table";
    break;
  case Memory:
    lVar2 = 6;
    pcVar3 = "memory";
    break;
  case Global:
    lVar2 = 6;
    pcVar3 = "global";
    break;
  case Tag:
    lVar2 = 3;
    pcVar3 = "tag";
    break;
  case Invalid:
    handle_unreachable("invalid ExternalKind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0xc0f);
  default:
    goto switchD_00a29221_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o,pcVar3,lVar2);
switchD_00a29221_default:
  local_50 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(this->o,&local_50,1);
  this_00 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
  if (*(__index_type *)
       ((long)&(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
    this_00 = &curr->value;
  }
  poVar1 = Name::print((Name *)this_00,this->o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"))",2);
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::ios_base::~ios_base(local_158);
  return;
}

Assistant:

void PrintSExpression::visitExport(Export* curr) {
  o << '(';
  printMedium(o, "export ");
  std::stringstream escaped;
  String::printEscaped(escaped, curr->name.str);
  printText(o, escaped.str(), false) << " (";
  switch (curr->kind) {
    case ExternalKind::Function:
      o << "func";
      break;
    case ExternalKind::Table:
      o << "table";
      break;
    case ExternalKind::Memory:
      o << "memory";
      break;
    case ExternalKind::Global:
      o << "global";
      break;
    case ExternalKind::Tag:
      o << "tag";
      break;
    case ExternalKind::Invalid:
      WASM_UNREACHABLE("invalid ExternalKind");
  }
  o << ' ';
  // TODO: specific case for type exports
  curr->getInternalName()->print(o) << "))";
}